

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O3

CURLcode operate(GlobalConfig *global,int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  ParameterError PVar3;
  CURLcode CVar4;
  CURLSH *share;
  size_t i;
  OperationConfig *config;
  
  pcVar1 = argv[1];
  setlocale(6,"");
  if (argc == 1) {
    parseconfig((char *)0x0,global);
  }
  else {
    iVar2 = curl_strequal(pcVar1,"-q");
    if (((iVar2 != 0) || (iVar2 = curl_strequal(pcVar1,"--disable"), iVar2 != 0)) ||
       (parseconfig((char *)0x0,global), 1 < argc)) goto LAB_00112dee;
  }
  if (global->first->url_list == (getout *)0x0) {
    helpf(global->errors,(char *)0x0);
    return CURLE_FAILED_INIT;
  }
LAB_00112dee:
  PVar3 = parse_args(global,argc,argv);
  switch(PVar3) {
  case PARAM_OK:
    if ((global->libcurl != (char *)0x0) && (CVar4 = easysrc_init(), CVar4 != CURLE_OK)) {
      errorf(global,"out of memory\n");
      return CVar4;
    }
    config = global->first;
    share = (CURLSH *)curl_share_init();
    if (share == (CURLSH *)0x0) {
      if (global->libcurl != (char *)0x0) {
        easysrc_cleanup();
        return CURLE_OUT_OF_MEMORY;
      }
      return CURLE_OUT_OF_MEMORY;
    }
    i = 0;
    curl_share_setopt(share,1,2);
    curl_share_setopt(share,1,3);
    curl_share_setopt(share,1,4);
    curl_share_setopt(share,1,5);
    curl_share_setopt(share,1,6);
    do {
      CVar4 = get_args(config,i);
      if (CVar4 != CURLE_OK) break;
      i = i + 1;
      config = config->next;
    } while (config != (OperationConfig *)0x0);
    global->current = global->first;
    CVar4 = run_all_transfers(global,share,CVar4);
    curl_share_cleanup(share);
    if (global->libcurl != (char *)0x0) {
      easysrc_cleanup();
      dumpeasysrc(global);
      return CVar4;
    }
    return CVar4;
  default:
    return CURLE_FAILED_INIT;
  case PARAM_HELP_REQUESTED:
    tool_help(global->help_category);
    break;
  case PARAM_MANUAL_REQUESTED:
    hugehelp();
    break;
  case PARAM_VERSION_INFO_REQUESTED:
    tool_version_info();
    break;
  case PARAM_ENGINES_REQUESTED:
    tool_list_engines();
    break;
  case PARAM_LIBCURL_UNSUPPORTED_PROTOCOL:
    return CURLE_UNSUPPORTED_PROTOCOL;
  }
  return CURLE_OK;
}

Assistant:

CURLcode operate(struct GlobalConfig *global, int argc, argv_item_t argv[])
{
  CURLcode result = CURLE_OK;
  char *first_arg = curlx_convert_tchar_to_UTF8(argv[1]);

  /* Setup proper locale from environment */
#ifdef HAVE_SETLOCALE
  setlocale(LC_ALL, "");
#endif

  /* Parse .curlrc if necessary */
  if((argc == 1) ||
     (!curl_strequal(first_arg, "-q") &&
      !curl_strequal(first_arg, "--disable"))) {
    parseconfig(NULL, global); /* ignore possible failure */

    /* If we had no arguments then make sure a url was specified in .curlrc */
    if((argc < 2) && (!global->first->url_list)) {
      helpf(global->errors, NULL);
      result = CURLE_FAILED_INIT;
    }
  }

  curlx_unicodefree(first_arg);

  if(!result) {
    /* Parse the command line arguments */
    ParameterError res = parse_args(global, argc, argv);
    if(res) {
      result = CURLE_OK;

      /* Check if we were asked for the help */
      if(res == PARAM_HELP_REQUESTED)
        tool_help(global->help_category);
      /* Check if we were asked for the manual */
      else if(res == PARAM_MANUAL_REQUESTED)
        hugehelp();
      /* Check if we were asked for the version information */
      else if(res == PARAM_VERSION_INFO_REQUESTED)
        tool_version_info();
      /* Check if we were asked to list the SSL engines */
      else if(res == PARAM_ENGINES_REQUESTED)
        tool_list_engines();
      else if(res == PARAM_LIBCURL_UNSUPPORTED_PROTOCOL)
        result = CURLE_UNSUPPORTED_PROTOCOL;
      else
        result = CURLE_FAILED_INIT;
    }
    else {
#ifndef CURL_DISABLE_LIBCURL_OPTION
      if(global->libcurl) {
        /* Initialise the libcurl source output */
        result = easysrc_init();
      }
#endif

      /* Perform the main operations */
      if(!result) {
        size_t count = 0;
        struct OperationConfig *operation = global->first;
        CURLSH *share = curl_share_init();
        if(!share) {
#ifndef CURL_DISABLE_LIBCURL_OPTION
          if(global->libcurl) {
            /* Cleanup the libcurl source output */
            easysrc_cleanup();
          }
#endif
          return CURLE_OUT_OF_MEMORY;
        }

        curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_COOKIE);
        curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_DNS);
        curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_SSL_SESSION);
        curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_CONNECT);
        curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_PSL);

        /* Get the required arguments for each operation */
        do {
          result = get_args(operation, count++);

          operation = operation->next;
        } while(!result && operation);

        /* Set the current operation pointer */
        global->current = global->first;

        /* now run! */
        result = run_all_transfers(global, share, result);

        curl_share_cleanup(share);
#ifndef CURL_DISABLE_LIBCURL_OPTION
        if(global->libcurl) {
          /* Cleanup the libcurl source output */
          easysrc_cleanup();

          /* Dump the libcurl code if previously enabled */
          dumpeasysrc(global);
        }
#endif
      }
      else
        errorf(global, "out of memory\n");
    }
  }

  return result;
}